

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O2

void __thiscall
GF2::MP<6ul,GF2::MOGrevlex<6ul>>::MP<3ul,GF2::MOGrevlex<6ul>>
          (MP<6ul,GF2::MOGrevlex<6ul>> *this,MP<3UL,_GF2::MOGrevlex<6UL>_> *polyRight)

{
  _List_node_base *p_Var1;
  MM<6UL> local_28;
  
  *(MP<6ul,GF2::MOGrevlex<6ul>> **)(this + 8) = this;
  *(MP<6ul,GF2::MOGrevlex<6ul>> **)this = this;
  *(undefined8 *)(this + 0x10) = 0;
  p_Var1 = (_List_node_base *)polyRight;
  while (p_Var1 = (((list<GF2::MM<3UL>,_std::allocator<GF2::MM<3UL>_>_> *)&p_Var1->_M_next)->
                  super__List_base<GF2::MM<3UL>,_std::allocator<GF2::MM<3UL>_>_>)._M_impl._M_node.
                  super__List_node_base._M_next, p_Var1 != (_List_node_base *)polyRight) {
    local_28.super_WW<6UL>._words[0] = *(WW<6UL> *)(p_Var1 + 1);
    MP<6UL,_GF2::MOGrevlex<6UL>_>::SymDiff((MP<6UL,_GF2::MOGrevlex<6UL>_> *)this,&local_28);
  }
  return;
}

Assistant:

MP(const MP<_m, _O1>& polyRight) 
	{	
		typename MP<_m, _O1>::const_iterator iter;
		for (iter = polyRight.begin(); iter != polyRight.end(); ++iter)
			SymDiff(MM<_n>(*iter));
	}